

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FException.cpp
# Opt level: O1

void __thiscall MeshLib::FException::what(FException *this)

{
  char *__s;
  size_t sVar1;
  
  __s = this->msg;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x11c1b0);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  return;
}

Assistant:

void
FException::what()
{
	std::cout << msg << std::endl;
}